

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O0

void __thiscall PerseusStationary::Load(PerseusStationary *this,string *filename)

{
  string *in_stack_00000608;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_ffffffffffffffd8;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_ffffffffffffffe0;
  
  AlphaVectorPlanning::ImportValueFunction(in_stack_00000608);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void PerseusStationary::Load(const std::string &filename)
{
    _m_valueFunction=ImportValueFunction(filename);
}